

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_suite.cpp
# Opt level: O0

void search_integer(void)

{
  bool bVar1;
  char *pcVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_ca8;
  basic_variable<std::allocator<char>_> *local_c88;
  iterator local_c60;
  iterator local_c48;
  iterator local_c30;
  iterator local_c18;
  iterator local_c00;
  undefined1 local_be8 [8];
  iterator where_9;
  int local_bc8;
  bool local_bc1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_bc0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_bb8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_b58;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_af8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a98;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a38;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_9d8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_978;
  undefined1 local_918 [24];
  variable subsequence_9;
  iterator local_8d0;
  iterator local_8b8;
  iterator local_8a0;
  iterator local_888;
  iterator local_870;
  undefined1 local_858 [8];
  iterator where_8;
  basic_variable<std::allocator<char>_> local_838;
  basic_variable<std::allocator<char>_> local_808;
  basic_variable<std::allocator<char>_> local_7d8;
  basic_variable<std::allocator<char>_> local_7a8;
  basic_variable<std::allocator<char>_> local_778;
  basic_variable<std::allocator<char>_> local_748;
  basic_variable<std::allocator<char>_> local_718;
  undefined1 local_6e8 [24];
  variable subsequence_8;
  iterator local_690;
  iterator local_678;
  iterator local_660;
  iterator local_648;
  undefined1 local_630 [8];
  iterator where_7;
  variable subsequence_7;
  iterator local_5d0;
  iterator local_5b8;
  iterator local_5a0;
  iterator local_588;
  undefined1 local_570 [8];
  iterator where_6;
  variable subsequence_6;
  iterator local_510;
  iterator local_4f8;
  iterator local_4e0;
  iterator local_4c8;
  undefined1 local_4b0 [8];
  iterator where_5;
  variable subsequence_5;
  iterator local_450;
  iterator local_438;
  iterator local_420;
  iterator local_408;
  undefined1 local_3f0 [8];
  iterator where_4;
  variable subsequence_4;
  iterator local_390;
  iterator local_378;
  iterator local_360;
  iterator local_348;
  undefined1 local_330 [8];
  iterator where_3;
  variable subsequence_3;
  iterator local_2e0;
  iterator local_2c8;
  difference_type local_2b0 [2];
  iterator local_2a0;
  iterator local_288;
  iterator local_270;
  iterator local_258;
  undefined1 local_240 [8];
  iterator where_2;
  variable subsequence_2;
  iterator local_1e0;
  iterator local_1c8;
  iterator local_1b0;
  iterator local_198;
  undefined1 local_180 [8];
  iterator where_1;
  variable subsequence_1;
  iterator local_130;
  iterator local_118;
  difference_type local_100 [2];
  iterator local_f0;
  iterator local_d8;
  iterator local_c0;
  iterator local_a8;
  undefined1 local_90 [8];
  iterator where;
  undefined1 local_68 [8];
  variable subsequence;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a8,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c0,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_d8,(basic_variable<std::allocator<char>_> *)local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_f0,(basic_variable<std::allocator<char>_> *)local_68);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_90,&local_a8,&local_c0,&local_d8,&local_f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_118,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_130,(iterator *)local_90);
  local_100[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_118,&local_130);
  subsequence_1.storage._44_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,199,"void search_integer()",local_100,&subsequence_1.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_130);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_198,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1b0,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1c8,
             (basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1e0,
             (basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_180,&local_198,&local_1b0,&local_1c8,&local_1e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&subsequence_2.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_180,(iterator *)&subsequence_2.storage.field_0x28);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0xce,"void search_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&subsequence_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_180);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_258,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_270,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_288,
             (basic_variable<std::allocator<char>_> *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2a0,
             (basic_variable<std::allocator<char>_> *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_240,&local_258,&local_270,&local_288,&local_2a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_270);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2c8,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_2e0,(iterator *)local_240);
  local_2b0[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_2c8,&local_2e0);
  subsequence_3.storage._44_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0xd5,"void search_integer()",local_2b0,&subsequence_3.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_240);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_348,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_360,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_378,
             (basic_variable<std::allocator<char>_> *)
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_390,
             (basic_variable<std::allocator<char>_> *)
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_330,&local_348,&local_360,&local_378,&local_390);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_390);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_378);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_360);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_348);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&subsequence_4.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_330,(iterator *)&subsequence_4.storage.field_0x28);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0xdc,"void search_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&subsequence_4.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_330);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_408,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_420,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_438,
             (basic_variable<std::allocator<char>_> *)
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_450,
             (basic_variable<std::allocator<char>_> *)
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_3f0,&local_408,&local_420,&local_438,&local_450);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_450);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_420);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_408);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&subsequence_5.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_3f0,(iterator *)&subsequence_5.storage.field_0x28);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0xe3,"void search_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&subsequence_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_3f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4c8,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_4e0,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4f8,
             (basic_variable<std::allocator<char>_> *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_510,
             (basic_variable<std::allocator<char>_> *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_4b0,&local_4c8,&local_4e0,&local_4f8,&local_510);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_510);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&subsequence_6.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_4b0,(iterator *)&subsequence_6.storage.field_0x28);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0xea,"void search_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&subsequence_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_4b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_588,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5a0,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5b8,
             (basic_variable<std::allocator<char>_> *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5d0,
             (basic_variable<std::allocator<char>_> *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_570,&local_588,&local_5a0,&local_5b8,&local_5d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&subsequence_7.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_570,(iterator *)&subsequence_7.storage.field_0x28);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0xf1,"void search_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&subsequence_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_570);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_648,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_660,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_678,
             (basic_variable<std::allocator<char>_> *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_690,
             (basic_variable<std::allocator<char>_> *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_630,&local_648,&local_660,&local_678,&local_690);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_690);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_678);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_660);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_648);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&subsequence_8.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_630,(iterator *)&subsequence_8.storage.field_0x28);
  pcVar2 = "void search_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0xf8,"void search_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&subsequence_8.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_630);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  where_8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_838;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)
             where_8.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,true);
  where_8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_808;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             where_8.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,2);
  where_8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_7d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)
             where_8.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,3.0);
  where_8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_7a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_8.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,"alpha");
  where_8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_778;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_8.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"bravo");
  where_8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_748;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_8.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"charlie");
  where_8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_718;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_8.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"delta");
  local_6e8._0_8_ = &local_838;
  local_6e8._8_8_ = 7;
  init._M_len = (size_type)pcVar2;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_6e8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_6e8._0_8_,init);
  local_c88 = (basic_variable<std::allocator<char>_> *)local_6e8;
  do {
    local_c88 = local_c88 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_c88);
  } while (local_c88 != &local_838);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_870,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_888,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8a0,(basic_variable<std::allocator<char>_> *)(local_6e8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_8b8,(basic_variable<std::allocator<char>_> *)(local_6e8 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_858,&local_870,&local_888,&local_8a0,&local_8b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_888);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_870);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_8d0,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_858,&local_8d0);
  pcVar2 = "void search_integer()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0xff,"void search_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6e8 + 0x10));
  local_bc0 = &local_bb8;
  local_bc1 = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_bc0,(char (*) [6])"alpha",&local_bc1);
  local_bc0 = &local_b58;
  local_bc8 = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_bc0,(char (*) [6])"bravo",&local_bc8);
  local_bc0 = &local_af8;
  where_9.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current.current = '\0';
  where_9.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._9_7_ = 0x40080000000000;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_double,_true>
            (local_bc0,(char (*) [8])"charlie",
             (double *)
             &where_9.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_bc0 = &local_a98;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[9],_true>
            (local_bc0,(char (*) [6])"delta",(char (*) [9])"hydrogen");
  local_bc0 = &local_a38;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_wchar_t_(&)[7],_true>
            (local_bc0,(char (*) [5])"echo",(wchar_t (*) [7])L"helium");
  local_bc0 = &local_9d8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char16_t_(&)[8],_true>
            (local_bc0,(char (*) [8])"foxtrot",(char16_t (*) [8])L"lithium");
  local_bc0 = &local_978;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char32_t_(&)[10],_true>
            (local_bc0,(char (*) [5])"golf",(char32_t (*) [10])L"beryllium");
  local_918._0_8_ = &local_bb8;
  local_918._8_8_ = 7;
  init_00._M_len = (size_type)pcVar2;
  init_00._M_array = (iterator)0x7;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_918 + 0x10),
             (basic_map<std::allocator<char>_> *)local_918._0_8_,init_00);
  local_ca8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_918;
  do {
    local_ca8 = local_ca8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_ca8);
  } while (local_ca8 != &local_bb8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_c00,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c18,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_c30,(basic_variable<std::allocator<char>_> *)(local_918 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c48,(basic_variable<std::allocator<char>_> *)(local_918 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_be8,&local_c00,&local_c18,&local_c30,&local_c48);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c48);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c30);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c18);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c00);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c60,(basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_be8,&local_c60);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x10f,"void search_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c60);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_be8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_918 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&subsequence.storage.field_0x28);
  return;
}

Assistant:

void search_integer()
{
    variable data(2);
    // integer - null
    {
        variable subsequence;
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        // Empty subsequence returns the first entry
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    // integer - boolean
    {
        variable subsequence(true);
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - integer
    {
        variable subsequence(2);
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    // integer - real
    {
        variable subsequence(3.0);
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - string
    {
        variable subsequence("alpha");
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - wstring
    {
        variable subsequence(L"bravo");
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - u16string
    {
        variable subsequence(u"charlie");
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - u32string
    {
        variable subsequence(U"delta");
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - array
    {
        variable subsequence = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // integer - map
    {
        variable subsequence = map::make(
            {
                { "alpha", true },
                { "bravo", 2 },
                { "charlie", 3.0 },
                { "delta", "hydrogen" },
                { "echo", L"helium" },
                { "foxtrot", u"lithium" },
                { "golf", U"beryllium" }
            });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
}